

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

char * stb_duplower(char *s)

{
  __int32_t *p_Var1;
  char *pcVar2;
  char *pcVar3;
  __int32_t **pp_Var4;
  char cVar5;
  
  pcVar3 = strdup(s);
  cVar5 = *pcVar3;
  if (cVar5 != '\0') {
    pp_Var4 = __ctype_tolower_loc();
    p_Var1 = *pp_Var4;
    pcVar2 = pcVar3;
    do {
      *pcVar2 = (char)p_Var1[cVar5];
      cVar5 = pcVar2[1];
      pcVar2 = pcVar2 + 1;
    } while (cVar5 != '\0');
  }
  return pcVar3;
}

Assistant:

char *stb_duplower(char *s)
{
   char *p = strdup(s), *q = p;
   while (*q) {
      *q = tolower(*q);
      ++q;
   }
   return p;
}